

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O3

int comex_create_mutexes(int num)

{
  if (num < 0) {
    __assert_fail("0 <= num",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x7df,"int comex_create_mutexes(int)");
  }
  if (l_state.mutexes != (int *)0x0) {
    __assert_fail("NULL == l_state.mutexes",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x7e0,"int comex_create_mutexes(int)");
  }
  if (l_state.num_mutexes != 0) {
    __assert_fail("0 == l_state.num_mutexes",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x7e1,"int comex_create_mutexes(int)");
  }
  if (l_state.lq_head == (comex_lock_t *)0x0) {
    if (l_state.lq_tail == (comex_lock_t *)0x0) {
      l_state.num_mutexes = num;
      if (num != 0) {
        l_state.mutexes = (int *)_my_malloc((ulong)(uint)num << 2);
        memset(l_state.mutexes,0xff,(ulong)(uint)num << 2);
      }
      return 0;
    }
    __assert_fail("NULL == l_state.lq_tail",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x7e3,"int comex_create_mutexes(int)");
  }
  __assert_fail("NULL == l_state.lq_head",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                ,0x7e2,"int comex_create_mutexes(int)");
}

Assistant:

int comex_create_mutexes(int num)
{
    int i=0;

    assert(0 <= num);
    assert(NULL == l_state.mutexes);
    assert(0 == l_state.num_mutexes);
    assert(NULL == l_state.lq_head);
    assert(NULL == l_state.lq_tail);

    l_state.num_mutexes = num;

    if (num > 0) {
        /* create all of the mutexes */
        l_state.mutexes = (int*)_my_malloc(num * sizeof(int));
        assert(l_state.mutexes);

        /* init all of my mutexes to unlocked */
        for (i=0; i<num; ++i) {
            l_state.mutexes[i] = -1;
        }
    }

    return COMEX_SUCCESS;
}